

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extprivkey.cpp
# Opt level: O0

void __thiscall
ExtPrivkey_DefaultConstructorTest_Test::TestBody(ExtPrivkey_DefaultConstructorTest_Test *this)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  char *in_R9;
  string local_190;
  AssertHelper local_170;
  Message local_168;
  bool local_159;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_;
  Message local_140;
  ByteData local_138;
  string local_120 [32];
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  Message local_e8 [3];
  ByteData local_d0;
  string local_b8 [32];
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  ExtPrivkey extkey;
  ExtPrivkey_DefaultConstructorTest_Test *this_local;
  
  cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)&gtest_ar.message_);
  cfd::core::ExtPrivkey::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_98,"\"\"","extkey.GetData().GetHex().c_str()","",pcVar3);
  std::__cxx11::string::~string(local_b8);
  cfd::core::ByteData::~ByteData(&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(local_e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_extprivkey.cpp"
               ,0x1b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  cfd::core::ExtPrivkey::GetVersionData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_100,"\"00000000\"","extkey.GetVersionData().GetHex().c_str()",
             "00000000",pcVar3);
  std::__cxx11::string::~string(local_120);
  cfd::core::ByteData::~ByteData(&local_138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_extprivkey.cpp"
               ,0x1c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  bVar2 = cfd::core::ExtPrivkey::IsValid();
  local_159 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_158,&local_159,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_190,(internal *)local_158,(AssertionResult *)"extkey.IsValid()","true","false"
               ,in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_extprivkey.cpp"
               ,0x1d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  cfd::core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(ExtPrivkey, DefaultConstructorTest) {
  ExtPrivkey extkey = ExtPrivkey();

  EXPECT_STREQ("", extkey.GetData().GetHex().c_str());
  EXPECT_STREQ("00000000", extkey.GetVersionData().GetHex().c_str());
  EXPECT_FALSE(extkey.IsValid());
}